

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O2

void view_from(int srow,int scol,char **loc_cs_rows,char *left_most,char *right_most,int range,
              _func_void_int_int_void_ptr *func,void *arg)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char *local_40;
  
  vis_func = func;
  varg = arg;
  pcVar1 = viz_clear_rows[srow];
  uVar7 = (ulong)scol;
  if (pcVar1[uVar7] == '\0') {
    if (scol == 0) {
      uVar6 = 0;
    }
    else {
      lVar2 = (long)scol;
      uVar6 = lVar2 - 1;
      if (pcVar1[lVar2 + -1] != '\0') {
        uVar6 = (ulong)(uint)(int)left_ptrs[(long)srow + -1][lVar2 + 0x4f];
      }
      if (scol == 0x4f) {
        uVar7 = 0x4f;
        goto LAB_0026d393;
      }
    }
    uVar7 = (long)scol + 1;
    if (pcVar1[(long)scol + 1] == '\0') goto LAB_0026d393;
  }
  else {
    uVar6 = (ulong)(uint)(int)left_ptrs[srow][uVar7];
  }
  uVar7 = (ulong)(uint)(int)right_ptrs[srow][uVar7];
LAB_0026d393:
  iVar5 = (int)uVar7;
  start_col = scol;
  start_row = srow;
  cs_rows = loc_cs_rows;
  cs_left = left_most;
  cs_right = right_most;
  if (range == 0) {
    local_40 = (char *)0x0;
    iVar4 = iVar5;
  }
  else {
    if (range - 0x10U < 0xfffffff1) {
      panic("view_from called with range %d",(ulong)(uint)range);
    }
    local_40 = "\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
               + (long)""[range] + 1;
    iVar4 = (int)uVar6;
    uVar6 = uVar6 & 0xffffffff;
    if (iVar4 <= scol - range) {
      uVar6 = (ulong)(uint)(scol - range);
    }
    iVar4 = range + scol;
    if (iVar5 < range + scol) {
      iVar4 = iVar5;
    }
  }
  iVar5 = (int)uVar6;
  if (func == (_func_void_int_int_void_ptr *)0x0) {
    pcVar1 = loc_cs_rows[srow];
    for (lVar2 = (long)iVar5; lVar2 <= iVar4; lVar2 = lVar2 + 1) {
      pcVar1[lVar2] = '\x01';
    }
    cs_left[srow] = (char)uVar6;
    cs_right[srow] = (char)iVar4;
  }
  else {
    uVar6 = uVar6 & 0xffffffff;
    while (iVar3 = (int)uVar6, iVar3 <= iVar4) {
      (*func)(iVar3,srow,arg);
      uVar6 = (ulong)(iVar3 + 1);
    }
  }
  if (srow < 0x14) {
    step = 1;
    if ((0x4e < scol) || (right_side(srow + 1,scol,iVar4,local_40), scol != 0)) {
      left_side(srow + 1,iVar5,scol,local_40);
    }
    if (srow < 1) {
      return;
    }
  }
  step = -1;
  if ((scol < 0x4f) && (right_side(srow + -1,scol,iVar4,local_40), scol == 0)) {
    return;
  }
  left_side(srow + -1,iVar5,scol,local_40);
  return;
}

Assistant:

static void view_from(
    int  srow, int scol,/* starting row and column */
    char **loc_cs_rows,	/* pointers to the rows of the could_see array */
    char *left_most,	/* min mark on each row */
    char *right_most,	/* max mark on each row */
    int range,		/* 0 if unlimited */
    void (*func)(int,int,void *),
    void *arg)
{
    int i;		/* loop counter */
    char         *rowp;		/* optimization for setting could_see */
    int		 nrow;		/* the next row */
    int		 left;		/* the left-most visible column */
    int		 right;		/* the right-most visible column */
    const char	 *limits;	/* range limit for next row */

    /* Set globals for q?_path(), left_side(), and right_side() to use. */
    start_col = scol;
    start_row = srow;
    cs_rows   = loc_cs_rows;	/* 'could see' rows */
    cs_left   = left_most;
    cs_right  = right_most;
    vis_func = func;
    varg = arg;

    /*
     * Determine extent of sight on the starting row.
     */
    if (is_clear(srow,scol)) {
	left =  left_ptrs[srow][scol];
	right = right_ptrs[srow][scol];
    } else {
	/*
	 * When in stone, you can only see your adjacent squares, unless
	 * you are on an array boundary or a stone/clear boundary.
	 */
	left  = (!scol) ? 0 :
		(is_clear(srow,scol-1) ? left_ptrs[srow][scol-1] : scol-1);
	right = (scol == COLNO-1) ? COLNO-1 :
		(is_clear(srow,scol+1) ? right_ptrs[srow][scol+1] : scol+1);
    }

    if (range) {
	if (range > MAX_RADIUS || range < 1)
	    panic("view_from called with range %d", range);
	limits = circle_ptr(range) + 1; /* start at next row */
	if (left < scol - range) left = scol - range;
	if (right > scol + range) right = scol + range;
    } else
	limits = NULL;

    if (func) {
	for (i = left; i <= right; i++) (*func)(i, srow, arg);
    } else {
	/* Row pointer optimization. */
	rowp = cs_rows[srow];

	/* We know that we can see our row. */
	for (i = left; i <= right; i++) set_cs(rowp,i);
	cs_left[srow]  = left;
	cs_right[srow] = right;
    }

    /*
     * Check what could be seen in quadrants.  We need to check for valid
     * rows here, since we don't do it in the routines right_side() and
     * left_side() [ugliness to remove extra routine calls].
     */
    if ( (nrow = srow+1) < ROWNO ) {	/* move down */
	step =  1;
	if (scol < COLNO-1) right_side(nrow, scol, right, limits);
	if (scol)	    left_side (nrow, left,  scol, limits);
    }

    if ( (nrow = srow-1) >= 0 ) {	/* move up */
	step = -1;
	if (scol < COLNO-1) right_side(nrow, scol, right, limits);
	if (scol)	    left_side (nrow, left,  scol, limits);
    }
}